

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSymFun(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint *Sign;
  size_t sVar6;
  char *__s;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint fVerbose;
  uint uVar10;
  char *pcVar11;
  uint nVars;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  iVar3 = -1;
LAB_0026a7d9:
  while (iVar2 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar2 == -1) {
    if (iVar3 != -1) {
      if (iVar3 - 0x11U < 0xfffffff0) {
        printf("Cannot generate functions for less than 1 and more than %d variables.\n");
        return 1;
      }
      Ntk_SymFunGenerate(iVar3,fVerbose);
      return 0;
    }
    if (globalUtilOptind + 1 == argc) {
      pcVar11 = argv[globalUtilOptind];
      sVar5 = strlen(pcVar11);
      nVars = (int)sVar5 - 1;
      if ((int)nVars < 0) goto LAB_0026a974;
      uVar8 = 0;
      while ((pcVar11[uVar8] & 0xfeU) == 0x30) {
        uVar8 = uVar8 + 1;
        if ((sVar5 & 0xffffffff) == uVar8) {
LAB_0026a974:
          iVar3 = 1 << ((char)sVar5 - 7U & 0x1f);
          if ((int)nVars < 7) {
            iVar3 = 1;
          }
          Sign = (uint *)calloc((long)iVar3,8);
          sVar6 = strlen(pcVar11);
          if ((int)sVar5 != (int)sVar6) {
            __assert_fail("(int)strlen(pOnes) == nVars + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
          }
          if (nVars != 0x1f) {
            uVar4 = 1 << ((byte)nVars & 0x1f);
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            uVar7 = 0;
            do {
              if ((int)nVars < 1) {
                uVar8 = 0;
              }
              else {
                uVar9 = 0;
                uVar10 = 0;
                do {
                  uVar9 = uVar9 + ((uVar7 >> (uVar10 & 0x1f) & 1) != 0);
                  uVar10 = uVar10 + 1;
                } while (nVars != uVar10);
                uVar8 = (ulong)uVar9;
              }
              if (pcVar11[uVar8] == '1') {
                *(ulong *)(Sign + (ulong)(uVar7 >> 6) * 2) =
                     *(ulong *)(Sign + (ulong)(uVar7 >> 6) * 2) ^ 1L << ((byte)uVar7 & 0x3f);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar4);
          }
          iVar3 = 2;
          if (2 < (int)nVars) {
            iVar3 = (1 << ((char)sVar5 - 3U & 0x1f)) + 1;
          }
          pcVar11 = (char *)calloc((long)iVar3,1);
          Extra_PrintHexadecimalString(pcVar11,Sign,nVars);
          if (Sign != (uint *)0x0) {
            free(Sign);
          }
          if (fVerbose == 0) {
            if ((int)nVars < 9) {
              puts(pcVar11);
            }
          }
          else if ((int)nVars < 7) {
            printf("Generated truth table of the %d-variable function (%s) and set it as the current network\n"
                   ,(ulong)nVars,pcVar11);
          }
          else {
            printf("Generated truth table of the %d-variable function and set it as the current network.\n"
                   ,(ulong)nVars);
          }
          sVar5 = strlen(pcVar11);
          __s = (char *)calloc(sVar5 + 100,1);
          sprintf(__s,"read_truth %s",pcVar11);
          Cmd_CommandExecute(pAbc,__s);
          if (__s != (char *)0x0) {
            free(__s);
          }
          if (pcVar11 != (char *)0x0) {
            free(pcVar11);
            return 0;
          }
          return 0;
        }
      }
      pcVar11 = "The string should be composed of zeros and ones.\n";
    }
    else {
      pcVar11 = "Not enough command-line arguments.\n";
    }
    iVar3 = -1;
  }
  else {
    if (iVar2 == 0x68) goto LAB_0026a86e;
    if (iVar2 != 0x4e) {
      pcVar11 = "Unknown switch.\n";
      iVar3 = -2;
      goto LAB_0026a867;
    }
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      goto LAB_0026a7d9;
    }
    pcVar11 = "Command line switch \"-N\" should be followed by a file name.\n";
    iVar3 = -1;
LAB_0026a867:
    Abc_Print(iVar3,pcVar11);
LAB_0026a86e:
    Abc_Print(-2,"usage: symfun [-N num] [-vh] <ones>\n");
    Abc_Print(-2,"\t           generated a single-output symmetric function\n");
    Abc_Print(-2,
              "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n"
             );
    pcVar11 = "yes";
    if (fVerbose == 0) {
      pcVar11 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar11);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    Abc_Print(-2,
              "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n")
    ;
    Abc_Print(-2,"\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n");
    pcVar11 = "\t           To get 5-input majority gate, use \"symfun 000111\".\n";
    iVar3 = -2;
  }
  Abc_Print(iVar3,pcVar11);
  return 1;
}

Assistant:

int Abc_CommandSymFun( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ntk_SymFunGenerate( int nVars, int fVerbose );
    word * pFun = NULL;
    char * pStr,  * pTruth, * pCommand;
    int c, k, nVars = -1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a file name.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( nVars != -1 )
    {
        if ( nVars < 1 || nVars > 16 )
        {
            printf( "Cannot generate functions for less than 1 and more than %d variables.\n", nVars );
            return 1;
        }
        Ntk_SymFunGenerate( nVars, fVerbose );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    // make sure the string is composed of N+1 zeros and ones
    pStr = argv[globalUtilOptind];
    nVars = strlen(pStr) - 1;
    for ( k = 0; k <= nVars; k++ )
        if ( pStr[k] != '0' && pStr[k] != '1' )
            break;
    if ( k <= nVars )
    {
        Abc_Print( -1, "The string should be composed of zeros and ones.\n" );
        return 1;
    }
    // generate and print one function
    pFun = Abc_TtSymFunGenerate( pStr, nVars );
    pTruth = ABC_CALLOC( char, nVars > 2 ? (1 << (nVars-2)) + 1 : 2 );
    Extra_PrintHexadecimalString( pTruth, (unsigned *)pFun, nVars );
    ABC_FREE( pFun );
    if ( fVerbose )
    {
        if ( nVars > 6 )
            printf( "Generated truth table of the %d-variable function and set it as the current network.\n", nVars );
        else
            printf( "Generated truth table of the %d-variable function (%s) and set it as the current network\n", nVars, pTruth );
    }
    else if ( nVars <= 8 )
        printf( "%s\n", pTruth );
    // read the truth table to be the current network in ABC
    pCommand = ABC_CALLOC( char, strlen(pTruth) + 100 );
    sprintf( pCommand, "read_truth %s", pTruth );
    Cmd_CommandExecute( pAbc, pCommand );
    ABC_FREE( pCommand );
    ABC_FREE( pTruth );
    return 0;

usage:
    Abc_Print( -2, "usage: symfun [-N num] [-vh] <ones>\n" );
    Abc_Print( -2, "\t           generated a single-output symmetric function\n" );
    Abc_Print( -2, "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n" );
    Abc_Print( -2, "\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n" );
    Abc_Print( -2, "\t           To get 5-input majority gate, use \"symfun 000111\".\n" );

    return 1;
}